

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall
nigel::Lexer::splitToken
          (Lexer *this,String *identifier,size_t index,iterator *token,
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
          *lexerStruct)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  value_type local_88;
  string local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__cxx11::string::substr((ulong)local_78,(ulong)identifier);
  std::make_shared<nigel::Token_Operator,std::__cxx11::string>(&local_58);
  local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._M_dataplus._M_p;
  local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::substr((ulong)local_78,(ulong)identifier);
  std::make_shared<nigel::Token_Operator,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&local_58.field_2 + 8));
  uVar4 = local_58.field_2._8_8_;
  local_58._M_dataplus._M_p = (pointer)local_58.field_2._8_8_;
  local_58._M_string_length = (size_type)_Stack_38._M_pi;
  local_58.field_2._8_8_ = 0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  std::__cxx11::string::~string(local_78);
  p_Var1 = token->_M_node[1]._M_next;
  p_Var2 = p_Var1[2]._M_prev;
  (local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lineNo =
       (size_t)p_Var1[2]._M_next;
  (local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->columnNo =
       (size_t)p_Var2;
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&((local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->line
               ).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)(p_Var1 + 3));
  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->path)
              .super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
             (token->_M_node[1]._M_next + 4));
  p_Var1 = token->_M_node[1]._M_next;
  *(_List_node_base **)(uVar4 + 0x28) =
       (_List_node_base *)((long)&(p_Var1[2]._M_prev)->_M_next + index);
  ((_List_node_base *)(uVar4 + 0x20))->_M_next = p_Var1[2]._M_next;
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               *)(uVar4 + 0x30),
              (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               *)(p_Var1 + 3));
  std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)(uVar4 + 0x40),
             (__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
             (token->_M_node[1]._M_next + 4));
  Token::as<nigel::Token_Operator>((Token *)local_78);
  std::__cxx11::string::_M_assign((string *)identifier);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
  std::__cxx11::list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
  ::insert(lexerStruct,token->_M_node,&local_88);
  p_Var1 = token->_M_node;
  p_Var2 = p_Var1[1]._M_next;
  p_Var3 = p_Var1[1]._M_prev;
  p_Var1[1]._M_next = (_List_node_base *)local_58._M_dataplus._M_p;
  p_Var1[1]._M_prev = (_List_node_base *)local_58._M_string_length;
  token->_M_node = token->_M_node->_M_prev;
  local_58._M_dataplus._M_p = (pointer)p_Var2;
  local_58._M_string_length = (size_type)p_Var3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Lexer::splitToken( String &identifier, size_t index, std::list<std::shared_ptr<Token>>::iterator &token, std::list<std::shared_ptr<Token>> &lexerStruct )
	{
		std::shared_ptr<Token> tmp1 = std::make_shared<Token_Operator>( identifier.substr( 0, index ) );
		std::shared_ptr<Token> tmp2 = std::make_shared<Token_Operator>( identifier.substr( index ) );

		tmp1->columnNo = ( *token )->columnNo;
		tmp1->lineNo = ( *token )->lineNo;
		tmp1->line = ( *token )->line;
		tmp1->path = ( *token )->path;
		tmp2->columnNo = ( *token )->columnNo + index;
		tmp2->lineNo = ( *token )->lineNo;
		tmp2->line = ( *token )->line;
		tmp2->path = ( *token )->path;

		identifier = tmp1->as<Token_Operator>()->operatorToken;
		lexerStruct.insert( token, tmp1 );
		token->swap( tmp2 );
		token--;
	}